

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

If_Grp_t *
If_CluCheck(If_Grp_t *__return_storage_ptr__,If_Man_t *p,word *pTruth0,int nVars,int iVarStart,
           int iVarStop,int nLutLeaf,int nLutRoot,If_Grp_t *pR,word *pFunc0,word *pFunc1,
           word *pLeftOver,int fHashing)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint *puVar5;
  word wVar6;
  word wVar7;
  long lVar8;
  uint uVar9;
  If_Grp_t *pIVar10;
  int *V2P_00;
  ulong uVar11;
  int Supp;
  uint uVar12;
  int v;
  int iVar13;
  If_Grp_t R;
  int V2P [18];
  int P2V [18];
  int P2V2 [18];
  int V2P2 [18];
  word pF [1024];
  word pTruth [1024];
  
  __return_storage_ptr__->pVars[0xe] = '\0';
  __return_storage_ptr__->pVars[0xf] = '\0';
  R.pVars[0xe] = '\0';
  R.pVars[0xf] = '\0';
  __return_storage_ptr__->nVars = '\0';
  __return_storage_ptr__->nMyu = '\0';
  __return_storage_ptr__->pVars[0] = '\0';
  __return_storage_ptr__->pVars[1] = '\0';
  __return_storage_ptr__->pVars[2] = '\0';
  __return_storage_ptr__->pVars[3] = '\0';
  __return_storage_ptr__->pVars[4] = '\0';
  __return_storage_ptr__->pVars[5] = '\0';
  __return_storage_ptr__->pVars[6] = '\0';
  __return_storage_ptr__->pVars[7] = '\0';
  __return_storage_ptr__->pVars[8] = '\0';
  __return_storage_ptr__->pVars[9] = '\0';
  __return_storage_ptr__->pVars[10] = '\0';
  __return_storage_ptr__->pVars[0xb] = '\0';
  __return_storage_ptr__->pVars[0xc] = '\0';
  __return_storage_ptr__->pVars[0xd] = '\0';
  R.nVars = '\0';
  R.nMyu = '\0';
  R.pVars[0] = '\0';
  R.pVars[1] = '\0';
  R.pVars[2] = '\0';
  R.pVars[3] = '\0';
  R.pVars[4] = '\0';
  R.pVars[5] = '\0';
  R.pVars[6] = '\0';
  R.pVars[7] = '\0';
  R.pVars[8] = '\0';
  R.pVars[9] = '\0';
  R.pVars[10] = '\0';
  R.pVars[0xb] = '\0';
  R.pVars[0xc] = '\0';
  R.pVars[0xd] = '\0';
  uVar3 = nVars;
  if (p != (If_Man_t *)0x0) {
    uVar3 = p->pPars->nLutSize;
  }
  if (0x10 < nVars) {
    __assert_fail("nVars <= CLU_VAR_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                  ,0x61b,
                  "If_Grp_t If_CluCheck(If_Man_t *, word *, int, int, int, int, int, If_Grp_t *, word *, word *, word *, int)"
                 );
  }
  iVar1 = nLutLeaf + nLutRoot;
  if (iVar1 <= nVars) {
    __assert_fail("nVars <= nLutLeaf + nLutRoot - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                  ,0x61c,
                  "If_Grp_t If_CluCheck(If_Man_t *, word *, int, int, int, int, int, If_Grp_t *, word *, word *, word *, int)"
                 );
  }
  if (pR != (If_Grp_t *)0x0) {
    pR->nVars = '\0';
    *pFunc0 = 0;
    *pFunc1 = 0;
  }
  If_CluCopy(pTruth,pTruth0,uVar3);
  If_CluCopy(pF,pTruth,nVars);
  uVar4 = 0;
  uVar11 = 0;
  if (0 < nVars) {
    uVar11 = (ulong)(uint)nVars;
  }
  for (; uVar11 != uVar4; uVar4 = uVar4 + 1) {
    P2V[uVar4] = (int)uVar4;
    V2P[uVar4] = (int)uVar4;
  }
  uVar12 = 0;
  for (iVar13 = 0; (int)uVar11 != iVar13; iVar13 = iVar13 + 1) {
    iVar2 = If_CluHasVar(pF,nVars,iVar13);
    uVar9 = 1 << ((byte)iVar13 & 0x1f);
    if (iVar2 == 0) {
      uVar9 = 0;
    }
    uVar12 = uVar12 | uVar9;
  }
  if (uVar12 == 0) {
    return __return_storage_ptr__;
  }
  if ((uVar12 + 1 & uVar12) != 0) {
    return __return_storage_ptr__;
  }
  if ((fHashing == 0 || p == (If_Man_t *)0x0) ||
     (puVar5 = If_CluHashLookup(p,pTruth,0), puVar5 == (uint *)0x0)) {
    puVar5 = (uint *)0x0;
  }
  else {
    uVar12 = *puVar5;
    if (uVar12 != 0xff) {
      pIVar10 = __return_storage_ptr__;
      for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 4) {
        pIVar10->nVars = (byte)(uVar12 >> ((byte)lVar8 & 0x1f)) & 0xf;
        pIVar10 = (If_Grp_t *)&pIVar10->nMyu;
      }
    }
  }
  if (iVarStop != 0) {
    If_CluMoveVar(pF,nVars,V2P,P2V,0,nVars + -1);
  }
  if ((__return_storage_ptr__->nVars == '\0') &&
     ((s_Count2 = s_Count2 + 1, iVarStart != 0 ||
      (If_CluDecUsingCofs(__return_storage_ptr__,pTruth,nVars,nLutLeaf),
      __return_storage_ptr__->nVars == '\0')))) {
    iVar13 = nVars + 1;
    If_CluFindGroup(__return_storage_ptr__,pF,nVars,iVarStart,iVarStop,V2P,P2V,nLutLeaf,
                    (uint)(iVar1 == iVar13));
    if (__return_storage_ptr__->nVars == '\0') {
      if (nVars < iVar1 + -2) {
        If_CluFindGroup(__return_storage_ptr__,pF,nVars,iVarStart,iVarStop,V2P,P2V,nLutLeaf + -1,
                        (uint)(nLutLeaf + nLutRoot + -1 == iVar13));
      }
      if (nVars < iVar1 + -3 && 4 < nLutLeaf) {
        If_CluFindGroup(__return_storage_ptr__,pF,nVars,iVarStart,iVarStop,V2P,P2V,nLutLeaf + -2,
                        (uint)(nLutLeaf + nLutRoot + -2 == iVar13));
      }
      if (__return_storage_ptr__->nVars == '\0') {
        If_CluReverseOrder(pF,nVars,V2P,P2V,iVarStart);
        If_CluFindGroup(__return_storage_ptr__,pF,nVars,iVarStart,iVarStop,V2P,P2V,nLutLeaf,
                        (uint)(iVar1 == iVar13));
        if (__return_storage_ptr__->nVars == '\0') goto LAB_0032a540;
      }
    }
  }
  if (pR != (If_Grp_t *)0x0) {
    If_CluMoveGroupToMsb(pF,nVars,V2P,P2V,__return_storage_ptr__);
    if (__return_storage_ptr__->nMyu == '\x02') {
      wVar6 = If_CluDeriveDisjoint(pF,nVars,V2P_00,P2V,__return_storage_ptr__,&R);
      iVar1 = -1;
    }
    else {
      wVar6 = If_CluDeriveNonDisjoint(pF,nVars,V2P_00,P2V,__return_storage_ptr__,&R);
      iVar1 = -2;
    }
    lVar8 = (long)iVar1 + (long)R.nVars;
    if (R.pVars[lVar8] != nVars) {
      __assert_fail("R.pVars[iNewPos] == nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                    ,0x6a5,
                    "If_Grp_t If_CluCheck(If_Man_t *, word *, int, int, int, int, int, If_Grp_t *, word *, word *, word *, int)"
                   );
    }
    wVar6 = If_CluAdjust(wVar6,(int)__return_storage_ptr__->nVars);
    if (R.nVars < 6) {
      pF[0] = If_CluAdjust(pF[0],(int)R.nVars);
    }
    if ((int)lVar8 < iVarStart) {
      __assert_fail("iNewPos >= iVarStart",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                    ,0x6b3,
                    "If_Grp_t If_CluCheck(If_Man_t *, word *, int, int, int, int, int, If_Grp_t *, word *, word *, word *, int)"
                   );
    }
    uVar4 = 0;
    uVar11 = 0;
    if ('\0' < R.nVars) {
      uVar11 = (ulong)(uint)(int)R.nVars;
    }
    for (; uVar11 != uVar4; uVar4 = uVar4 + 1) {
      P2V2[uVar4] = (int)uVar4;
      V2P2[uVar4] = (int)uVar4;
    }
    If_CluMoveVar(pF,(int)R.nVars,V2P2,P2V2,(int)lVar8,iVarStart);
    for (; iVarStart < lVar8; lVar8 = lVar8 + -1) {
      R.pVars[lVar8] = R.pVars[lVar8 + -1];
    }
    R.pVars[iVarStart] = (char)nVars;
    if (pLeftOver != (word *)0x0) {
      uVar12 = (uint)R.nVars;
      if ((int)uVar12 < 6) {
        wVar7 = If_CluAdjust(pF[0],uVar12);
        *pLeftOver = wVar7;
        uVar12 = (uint)R.nVars;
      }
      else {
        If_CluCopy(pLeftOver,pF,uVar12);
      }
      if (uVar3 != uVar12) {
        if ((int)uVar3 <= (int)uVar12) {
          __assert_fail("nVarsCur < nVarsMax",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                        ,0x18b,"void If_CluAdjustBig(word *, int, int)");
        }
        uVar9 = 6;
        if (6 < (int)uVar12) {
          uVar9 = uVar12;
        }
        for (; (int)uVar9 < (int)uVar3; uVar9 = uVar9 + 1) {
          iVar1 = 1 << ((char)uVar9 - 6U & 0x1f);
          if (uVar9 < 7) {
            iVar1 = 1;
          }
          If_CluCopy(pLeftOver + iVar1,pLeftOver,uVar9);
        }
      }
    }
    *(undefined2 *)(pR->pVars + 0xe) = R.pVars._14_2_;
    pR->nVars = R.nVars;
    pR->nMyu = R.nMyu;
    pR->pVars[0] = R.pVars[0];
    pR->pVars[1] = R.pVars[1];
    pR->pVars[2] = R.pVars[2];
    pR->pVars[3] = R.pVars[3];
    pR->pVars[4] = R.pVars[4];
    pR->pVars[5] = R.pVars[5];
    *(undefined8 *)(pR->pVars + 6) = R.pVars._6_8_;
    if (pFunc0 != (word *)0x0) {
      *pFunc0 = pF[0];
    }
    if (pFunc1 != (word *)0x0) {
      *pFunc1 = wVar6;
    }
  }
LAB_0032a540:
  if (puVar5 != (uint *)0x0) {
    uVar3 = If_CluGrp2Uns(__return_storage_ptr__);
    *puVar5 = uVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

If_Grp_t If_CluCheck( If_Man_t * p, word * pTruth0, int nVars, int iVarStart, int iVarStop, int nLutLeaf, int nLutRoot, 
                     If_Grp_t * pR, word * pFunc0, word * pFunc1, word * pLeftOver, int fHashing )
{
//    int fEnableHashing = 0;
    If_Grp_t G1 = {0}, R = {0};
    unsigned * pHashed = NULL;
    word Truth, pTruth[CLU_WRD_MAX], pF[CLU_WRD_MAX];//, pG[CLU_WRD_MAX];
    int V2P[CLU_VAR_MAX+2], P2V[CLU_VAR_MAX+2], pCanonPerm[CLU_VAR_MAX];
    int i, nSupp, uCanonPhase;
    int nLutSize = p ? p->pPars->nLutSize : nVars;
    assert( nVars <= CLU_VAR_MAX );
    assert( nVars <= nLutLeaf + nLutRoot - 1 );

    if ( pR )
    {
        pR->nVars = 0;
        *pFunc0 = 0;
        *pFunc1 = 0;
    }

    // canonicize truth table
    If_CluCopy( pTruth, pTruth0, nLutSize );

    if ( 0 )
    {
        uCanonPhase = If_CluSemiCanonicize( pTruth, nVars, pCanonPerm );
        If_CluAdjustBig( pTruth, nVars, nLutSize );
    }

//    If_CluSemiCanonicizeVerify( pTruth, pTruth0, nVars, pCanonPerm, uCanonPhase );
//    If_CluCopy( pTruth, pTruth0, nLutSize );

 /*
    {
        int pCanonPerm[32];
        short pStore[32];
        unsigned uCanonPhase;
        If_CluCopy( pF, pTruth, nVars );
        uCanonPhase = Kit_TruthSemiCanonicize( pF, pG, nVars, pCanonPerm );
        G1.nVars = 1;
        return G1;
    }
*/
    // check minnimum base
    If_CluCopy( pF, pTruth, nVars );
    for ( i = 0; i < nVars; i++ )
        V2P[i] = P2V[i] = i;
    // check support
    nSupp = If_CluSupport( pF, nVars );
//Extra_PrintBinary( stdout, &nSupp, 16 );  printf( "\n" );
    if ( !nSupp || !If_CluSuppIsMinBase(nSupp) )
    {
//        assert( 0 );     
        return G1;
    }

    // check hash table
    if ( p && fHashing )
    {
        pHashed = If_CluHashLookup( p, pTruth, 0 );
        if ( pHashed && *pHashed != CLU_UNUSED )
            If_CluUns2Grp( *pHashed, &G1 );
    }

    // update the variable order so that the first var was the last one
    if ( iVarStop )
        If_CluMoveVar( pF, nVars, V2P, P2V, 0, nVars-1 );

    if ( G1.nVars == 0 ) 
    {
        s_Count2++;

        // detect easy cofs
        if ( iVarStart == 0 )
            G1 = If_CluDecUsingCofs( pTruth, nVars, nLutLeaf );
        if ( G1.nVars == 0 )
        {
            // perform testing
            G1 = If_CluFindGroup( pF, nVars, iVarStart, iVarStop, V2P, P2V, nLutLeaf, nLutLeaf + nLutRoot == nVars + 1 );
    //        If_CluCheckPerm( pTruth, pF, nVars, V2P, P2V );
            if ( G1.nVars == 0 )
            {
                // perform testing with a smaller set
                if ( nVars < nLutLeaf + nLutRoot - 2 )
                {
                    nLutLeaf--;
                    G1 = If_CluFindGroup( pF, nVars, iVarStart, iVarStop, V2P, P2V, nLutLeaf, nLutLeaf + nLutRoot == nVars + 1 );
                    nLutLeaf++;
                }
                // perform testing with a smaller set
                if ( nLutLeaf > 4 && nVars < nLutLeaf + nLutRoot - 3 )
                {
                    nLutLeaf--;
                    nLutLeaf--;
                    G1 = If_CluFindGroup( pF, nVars, iVarStart, iVarStop, V2P, P2V, nLutLeaf, nLutLeaf + nLutRoot == nVars + 1 );
                    nLutLeaf++;
                    nLutLeaf++;
                }
                if ( G1.nVars == 0 )
                {
                    // perform testing with a different order
                    If_CluReverseOrder( pF, nVars, V2P, P2V, iVarStart );
                    G1 = If_CluFindGroup( pF, nVars, iVarStart, iVarStop, V2P, P2V, nLutLeaf, nLutLeaf + nLutRoot == nVars + 1 );

                    // check permutation
    //                If_CluCheckPerm( pTruth, pF, nVars, V2P, P2V );
                    if ( G1.nVars == 0 )
                    {
                        // remember free set, just in case
//                        for ( i = 0; i < nVars - nLutLeaf; i++ )
///                           G1.pVars[nLutLeaf+i] = P2V[i];
                        // if <XY>, this will not be used
                        // if <XYZ>, this will not be hashed

    /*
                        if ( nVars == 6 )
                        {
                            Extra_PrintHex( stdout, (unsigned *)pF, nVars );  printf( "    " );
                            Kit_DsdPrintFromTruth( (unsigned*)pF, nVars );  printf( "\n" );
                            if ( !If_CutPerformCheck07( (unsigned *)pF, 6, 6, NULL ) )
                                printf( "no\n" );
                        } 
    */
                        if ( pHashed )
                            *pHashed = If_CluGrp2Uns( &G1 );
                        return G1;
                    }
                }
            }
        }
    }

    // derive
    if ( pR )
    {
        int iNewPos;

        If_CluMoveGroupToMsb( pF, nVars, V2P, P2V, &G1 );
        if ( G1.nMyu == 2 )
        {
            Truth = If_CluDeriveDisjoint( pF, nVars, V2P, P2V, &G1, &R );
            iNewPos = R.nVars - 1;
        }
        else
        {
            Truth = If_CluDeriveNonDisjoint( pF, nVars, V2P, P2V, &G1, &R );
            iNewPos = R.nVars - 2;
        }
        assert( R.pVars[iNewPos] == nVars );

        // adjust the functions
        Truth = If_CluAdjust( Truth, G1.nVars );
        if ( R.nVars < 6 )
            pF[0] = If_CluAdjust( pF[0], R.nVars );

//        Kit_DsdPrintFromTruth( (unsigned*)&Truth, G1.nVars ); printf( "  ...1\n" );
//        Kit_DsdPrintFromTruth( (unsigned*)pF, R.nVars );      printf( "  ...1\n" );

        // update the variable order of R so that the new var was the first one
//        if ( iVarStart == 0 )
        {
            int k, V2P2[CLU_VAR_MAX+2], P2V2[CLU_VAR_MAX+2];
            assert( iNewPos >= iVarStart );
            for ( k = 0; k < R.nVars; k++ )
                V2P2[k] = P2V2[k] = k;
            If_CluMoveVar( pF, R.nVars, V2P2, P2V2, iNewPos, iVarStart );
            for ( k = iNewPos; k > iVarStart; k-- )
                R.pVars[k] = R.pVars[k-1];
            R.pVars[iVarStart] = nVars;
        }

//        Kit_DsdPrintFromTruth( (unsigned*)pF, R.nVars ); printf( "  ...2\n" );

        if ( pLeftOver )
        {
            if ( R.nVars < 6 )
                *pLeftOver = If_CluAdjust( pF[0], R.nVars );
            else
                If_CluCopy( pLeftOver, pF, R.nVars );
            If_CluAdjustBig( pLeftOver, R.nVars, nLutSize );
        }

        // perform checking
        if ( 0 )
        {
            If_CluCheckGroup( pTruth, nVars, &G1 );
            If_CluVerify( pTruth, nVars, &G1, &R, Truth, pF );
        } 

        // save functions
        *pR = R;
        if ( pFunc0 )
            *pFunc0 = pF[0];
        if ( pFunc1 )
            *pFunc1 = Truth;
    }

    if ( pHashed )
        *pHashed = If_CluGrp2Uns( &G1 );
    return G1;
}